

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>_>
      *this,Module *module)

{
  PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
  *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  char cVar1;
  PassRunner *pPVar2;
  pointer puVar3;
  Global *pGVar4;
  pointer puVar5;
  Function *pFVar6;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> uVar7;
  undefined8 *puVar8;
  pointer puVar9;
  DataSegment *pDVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  undefined8 *puVar14;
  PassOptions *pPVar15;
  bool *pbVar16;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar17;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_2;
  __hashtable_alloc *p_Var18;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr_1;
  pointer puVar19;
  pointer puVar20;
  byte bVar21;
  PassOptions local_2b8;
  undefined1 local_200 [8];
  PassRunner runner;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_90;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_58;
  __alloc_node_gen_t __alloc_node_gen_2;
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_38;
  
  bVar21 = 0;
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    iVar12 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((char)iVar12 == '\0') {
      this_00 = &this->
                 super_PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
      ;
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
      .currModule = module;
      puVar3 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar17 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar3;
          puVar17 = puVar17 + 1) {
        pGVar4 = (puVar17->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if ((pGVar4->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
                 ,&pGVar4->init);
        }
        cVar1 = pGVar4->init->_id;
        if ((cVar1 != ')') &&
           ((cVar1 != '\x0e' || (bVar11 = Literal::isZero((Literal *)(pGVar4->init + 1)), !bVar11)))
           ) {
          anon_unknown_150::GlobalAssignmentCollector::recordGlobalAssignment
                    ((GlobalAssignmentCollector *)this,
                     (IString)*(IString *)&(pGVar4->super_Importable).super_Named);
        }
      }
      puVar5 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar19 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar5;
          puVar19 = puVar19 + 1) {
        pFVar6 = (puVar19->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((pFVar6->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          (this->
          super_PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          ).
          super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          .currFunction = pFVar6;
          Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
                 ,&pFVar6->body);
          (this->
          super_PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          ).
          super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          .currFunction = (Function *)0x0;
        }
      }
      p_Var18 = (__hashtable_alloc *)
                (module->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __alloc_node_gen_2._M_h =
           (__hashtable_alloc *)
           (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var18 != __alloc_node_gen_2._M_h) {
        do {
          uVar7._M_t.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
               *(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                 *)p_Var18;
          if (*(long *)((long)uVar7._M_t.
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                       0x20) != 0) {
            Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
            ::walk(&this_00->
                    super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
                   ,(Expression **)
                    ((long)uVar7._M_t.
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28
                    ));
          }
          puVar8 = *(undefined8 **)
                    ((long)uVar7._M_t.
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40
                    );
          for (puVar14 = *(undefined8 **)
                          ((long)uVar7._M_t.
                                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl
                          + 0x38); puVar14 != puVar8; puVar14 = puVar14 + 1) {
            local_200 = (undefined1  [8])*puVar14;
            Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
            ::walk(&this_00->
                    super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
                   ,(Expression **)local_200);
          }
          p_Var18 = p_Var18 + 8;
        } while (p_Var18 != __alloc_node_gen_2._M_h);
      }
      puVar9 = (module->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar20 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar9;
          puVar20 = puVar20 + 1) {
        pDVar10 = (puVar20->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar10->isPassive == false) {
          Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
                 ,&pDVar10->offset);
        }
      }
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalAssignmentCollector,_void>_>
      .currModule = (Module *)0x0;
    }
    else {
      pPVar2 = (this->super_Pass).runner;
      pPVar15 = &pPVar2->options;
      pbVar16 = &runner.isNested;
      for (lVar13 = 8; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(undefined8 *)pbVar16 = *(undefined8 *)pPVar15;
        pPVar15 = (PassOptions *)((long)pPVar15 + (ulong)bVar21 * -0x10 + 8);
        pbVar16 = pbVar16 + (ulong)bVar21 * -0x10 + 8;
      }
      bVar11 = (pPVar2->options).targetJS;
      local_c8._M_buckets = (__buckets_ptr)0x0;
      local_c8._M_bucket_count = (pPVar2->options).arguments._M_h._M_bucket_count;
      local_c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_c8._M_element_count = (pPVar2->options).arguments._M_h._M_element_count;
      local_c8._M_rehash_policy._M_max_load_factor =
           (pPVar2->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
      local_c8._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar2->options).arguments._M_h._M_rehash_policy.field_0x4;
      local_c8._M_rehash_policy._M_next_resize =
           (pPVar2->options).arguments._M_h._M_rehash_policy._M_next_resize;
      local_c8._M_single_bucket = (__node_base_ptr)0x0;
      local_200 = (undefined1  [8])&local_c8;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_c8,&(pPVar2->options).arguments._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)local_200);
      local_200 = (undefined1  [8])&local_90;
      local_90._M_buckets = (__buckets_ptr)0x0;
      local_90._M_bucket_count = (pPVar2->options).passesToSkip._M_h._M_bucket_count;
      local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_90._M_element_count = (pPVar2->options).passesToSkip._M_h._M_element_count;
      local_90._M_rehash_policy._M_max_load_factor =
           (pPVar2->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
      local_90._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar2->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
      local_90._M_rehash_policy._M_next_resize =
           (pPVar2->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
      local_90._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_200,&(pPVar2->options).passesToSkip._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)local_200);
      runner._236_4_ =
           ~-(uint)((int)runner._236_4_ < 1) & 1 | runner._236_4_ & -(uint)((int)runner._236_4_ < 1)
      ;
      pbVar16 = &runner.isNested;
      pPVar15 = &local_2b8;
      for (lVar13 = 8; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(undefined8 *)pPVar15 = *(undefined8 *)pbVar16;
        pbVar16 = pbVar16 + (ulong)bVar21 * -0x10 + 8;
        pPVar15 = (PassOptions *)((long)pPVar15 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      this_01 = &local_2b8.arguments;
      local_2b8.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
      local_2b8.arguments._M_h._M_bucket_count = local_c8._M_bucket_count;
      local_2b8.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_2b8.arguments._M_h._M_element_count = local_c8._M_element_count;
      local_2b8.arguments._M_h._M_rehash_policy._M_max_load_factor =
           local_c8._M_rehash_policy._M_max_load_factor;
      local_2b8.arguments._M_h._M_rehash_policy._4_4_ = local_c8._M_rehash_policy._4_4_;
      local_2b8.arguments._M_h._M_rehash_policy._M_next_resize =
           local_c8._M_rehash_policy._M_next_resize;
      local_2b8.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_2b8.targetJS = bVar11;
      local_58._M_h = (__hashtable_alloc *)this_01;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_01,&local_c8,&local_58);
      this_02 = &local_2b8.passesToSkip;
      local_2b8.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
      local_2b8.passesToSkip._M_h._M_bucket_count = local_90._M_bucket_count;
      local_2b8.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_2b8.passesToSkip._M_h._M_element_count = local_90._M_element_count;
      local_2b8.passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
           local_90._M_rehash_policy._M_max_load_factor;
      local_2b8.passesToSkip._M_h._M_rehash_policy._4_4_ = local_90._M_rehash_policy._4_4_;
      local_2b8.passesToSkip._M_h._M_rehash_policy._M_next_resize =
           local_90._M_rehash_policy._M_next_resize;
      local_2b8.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_58._M_h = (__hashtable_alloc *)this_02;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_02,&local_90,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)&local_58);
      PassRunner::PassRunner((PassRunner *)local_200,module,&local_2b8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&this_02->_M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&this_01->_M_h);
      runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
      (*(this->super_Pass)._vptr_Pass[5])(&local_38,this);
      PassRunner::add((PassRunner *)local_200,
                      (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_38);
      if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
          local_38._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
        (**(code **)(*(long *)local_38._M_t.
                              super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                              .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))();
      }
      local_38._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
           (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
           (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)0x0;
      PassRunner::run((PassRunner *)local_200);
      PassRunner::~PassRunner((PassRunner *)local_200);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_90);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_c8);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x203,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::(anonymous namespace)::GlobalAssignmentCollector>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::(anonymous namespace)::GlobalAssignmentCollector>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }